

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O0

uchar * pstore::varint::encode<unsigned_char*>(uint64_t x,uchar *out)

{
  uint uVar1;
  uint local_20;
  uint bytes;
  uint bits;
  uchar *out_local;
  uint64_t x_local;
  
  uVar1 = bit_count::clz(x | 1);
  if (-uVar1 + 0x40 < 0x39) {
    local_20 = (-uVar1 + 0x3f) / 7 + 1;
    out_local = (uchar *)(x * 2 + 1 << ((char)local_20 - 1U & 0x3f));
    _bytes = out;
  }
  else {
    local_20 = 8;
    _bytes = out + 1;
    *out = '\0';
    out_local = (uchar *)x;
  }
  if (8 < local_20) {
    assert_failed("bytes < 9",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/varint.hpp"
                  ,0x5c);
  }
  switch(local_20) {
  case 8:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  case 7:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  case 6:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  case 5:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  case 4:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  case 3:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  case 2:
    *_bytes = (uchar)out_local;
    out_local = (uchar *)((ulong)out_local >> 8);
    _bytes = _bytes + 1;
  default:
    *_bytes = (uchar)out_local;
    return _bytes + 1;
  }
}

Assistant:

OutputIterator encode (std::uint64_t x, OutputIterator out) {
            unsigned const bits = 64U - bit_count::clz (x | 1U);
            unsigned bytes;
            if (bits > 56U) {
                bytes = 8U;
                *(out++) = 0U;
            } else {
                bytes = (bits - 1U) / 7U + 1U;
                // Encode the number of bytes in the low bits of the value itself.
                x = (2U * x + 1U) << (bytes - 1U);
            }
            PSTORE_ASSERT (bytes < 9);
            // clang-format off
            switch (bytes) {
            // NOLINTNEXTLINE(bugprone-branch-clone)
            case 8: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 7: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 6: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 5: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 4: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 3: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            case 2: *(out++) = x & 0xFFU; x >>= 8U; PSTORE_FALLTHROUGH;
            default:
                *(out++) = x & 0xFFU;
            }
            // clang-format on
            return out;
        }